

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::printOriginalList(Graph *this)

{
  int *piVar1;
  ostream *poVar2;
  const_iterator __begin2;
  int *piVar3;
  long lVar4;
  
  if (this->adjoint_status == true) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Original Graph: ");
    std::endl<char,std::char_traits<char>>(poVar2);
    for (lVar4 = 0x2bc8; lVar4 != 0x3078; lVar4 = lVar4 + 0x18) {
      piVar3 = *(int **)((long)(this->adj_matrix + -1) + 0xc4 + lVar4);
      piVar1 = *(int **)((long)this->adj_matrix[0] + lVar4 + 4);
      if (piVar3 != piVar1) {
        for (; piVar3 != piVar1; piVar3 = piVar3 + 1) {
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar3);
          std::operator<<(poVar2,' ');
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
    }
  }
  return;
}

Assistant:

void Graph::printOriginalList(){
   if(not(this->adjoint_status)) return void();
   cout << "Original Graph: "<<endl;
   for(const auto &i : this->original_list){
      if(i.empty()) continue;
      for(const int &j: i)
         cout<< j << ' ';
      cout << endl;
   }
}